

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_param_tests.hpp
# Opt level: O2

iuParamGenerator<int> __thiscall iutest::Range<int>(iutest *this,int begin,int end,int step)

{
  undefined8 *puVar1;
  _Interface *extraout_RDX;
  iuParamGenerator<int> iVar2;
  
  puVar1 = (undefined8 *)operator_new(0x18);
  *puVar1 = &PTR__iuIParamGenerator_00135628;
  *(int *)(puVar1 + 1) = begin;
  *(int *)((long)puVar1 + 0xc) = end;
  *(int *)(puVar1 + 2) = step;
  *(int *)((long)puVar1 + 0x14) = begin;
  *(undefined ***)this = &PTR__iuIParamGenerator_00135690;
  *(undefined8 **)(this + 8) = puVar1;
  iVar2.m_pInterface = extraout_RDX;
  iVar2.super_iuIParamGenerator<int>._vptr_iuIParamGenerator = (_func_int **)this;
  return iVar2;
}

Assistant:

detail::iuParamGenerator<T> IUTEST_ATTRIBUTE_UNUSED_ Range(T begin, T end, T step=static_cast<T>(1))
{
    return new detail::iuRangeParamsGenerator<T>(begin, end, step);
}